

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::parallel_node_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(InsertHint<phmap::parallel_node_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined8 uVar1;
  result_type_conflict1 rVar2;
  mt19937_64 *__urng;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  T val2;
  T val;
  TypeParam m;
  AssertHelper local_540;
  AssertHelper local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  undefined1 local_528 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518 [2];
  AssertHelper local_4f0;
  undefined1 local_4e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  result_type_conflict1 local_4c8 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_4c0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_498;
  
  hash_internal::
  Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
  ::operator()(&local_4c0,
               (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
                *)&local_498);
  lVar3 = 0x40;
  do {
    *(undefined8 *)((long)local_4c8 + lVar3) = 0;
    *(undefined8 *)((long)&local_4c0.first._M_dataplus._M_p + lVar3) = 0;
    *(undefined8 *)((long)local_4c8 + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)local_4c8 + lVar3 + -8) = 0;
    *(undefined8 *)((long)local_498.sets_._M_elems + lVar3 + -0x18) = 0;
    *(long *)((long)local_498.sets_._M_elems + lVar3 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_498.sets_._M_elems + lVar3 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_498.sets_._M_elems[0].set_.ctrl_ + lVar3) = 0;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x4c0);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::
  emplace<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_0>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
              *)local_528,&local_498,&local_4c0);
  uVar1 = local_518[0]._8_8_;
  local_4e8[0] = local_528 != (undefined1  [8])0x0;
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_528 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)local_4e8,(AssertionResult *)"it != m.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x47,(char *)local_528);
    testing::internal::AssertHelper::operator=(&local_540,(Message *)&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if (local_528 != (undefined1  [8])local_518) {
      operator_delete((void *)local_528,(ulong)(local_518[0]._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_538.data_._1_7_,local_538.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_538.data_._1_7_,local_538.data_._0_1_) + 8))();
    }
  }
  if (local_4e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4e0,local_4e0);
  }
  testing::internal::
  CmpHelperEQ<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>
            ((internal *)local_528,"val","*it",&local_4c0,
             *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               **)uVar1);
  if (local_528[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4e8);
    if (local_520 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_520->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x48,pcVar4);
    testing::internal::AssertHelper::operator=(&local_538,(Message *)local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_4e8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_4e8 + 8))();
    }
  }
  if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_520,local_520);
  }
  local_528 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)local_528,__urng,(param_type *)local_528);
  local_4e8 = (undefined1  [8])&local_4d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4e8,local_4c0.first._M_dataplus._M_p,
             local_4c0.first._M_dataplus._M_p + local_4c0.first._M_string_length);
  local_4c8[0] = rVar2;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::
  emplace<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_0>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
              *)local_528,&local_498,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_4e8);
  local_538.data_._0_1_ = (internal)(local_528 != (undefined1  [8])0x0);
  local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_538.data_._0_1_) {
    testing::Message::Message((Message *)&local_540);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_528,(internal *)&local_538,(AssertionResult *)"it != m.end()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4b,(char *)local_528);
    testing::internal::AssertHelper::operator=(&local_4f0,(Message *)&local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_4f0);
    if (local_528 != (undefined1  [8])local_518) {
      operator_delete((void *)local_528,(ulong)(local_518[0]._M_allocated_capacity + 1));
    }
    if (local_540.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_540.data_ + 8))();
    }
  }
  if (local_530 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_530,local_530);
  }
  testing::internal::
  CmpHelperEQ<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>
            ((internal *)local_528,"val","*it",&local_4c0,
             *(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               **)local_518[0]._8_8_);
  if (local_528[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_538);
    if (local_520 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_520->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_540,(Message *)&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    if ((long *)CONCAT71(local_538.data_._1_7_,local_538.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_538.data_._1_7_,local_538.data_._0_1_) + 8))();
    }
  }
  if (local_520 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_520,local_520);
  }
  if (local_4e8 != (undefined1  [8])&local_4d8) {
    operator_delete((void *)local_4e8,local_4d8._M_allocated_capacity + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~parallel_hash_set(&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0.first._M_dataplus._M_p != &local_4c0.first.field_2) {
    operator_delete(local_4c0.first._M_dataplus._M_p,
                    local_4c0.first.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.insert(it, val2);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}